

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.hpp
# Opt level: O2

void __thiscall
poplar::
map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>::
show_stats(map<poplar::plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>,_poplar::plain_bonsai_nlm<int>_>
           *this,ostream *os,int n)

{
  string indent;
  uint64_t local_48;
  string local_40;
  
  get_indent_abi_cxx11_(&local_40,(poplar *)(ulong)(uint)n,n);
  show_stat<char[4]>(os,&local_40,"name",(char (*) [4])"map");
  show_stat<unsigned_long>(os,&local_40,"lambda",&this->lambda_);
  local_48 = this->size_;
  show_stat<unsigned_long>(os,&local_40,"size",&local_48);
  local_48 = alloc_bytes(this);
  show_stat<unsigned_long>(os,&local_40,"alloc_bytes",&local_48);
  show_member(os,&local_40,"hash_trie_");
  plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::show_stats(&this->hash_trie_,os,n + 1);
  show_member(os,&local_40,"label_store_");
  plain_bonsai_nlm<int>::show_stats(&this->label_store_,os,n + 1);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void show_stats(std::ostream& os, int n = 0) const {
        auto indent = get_indent(n);
        show_stat(os, indent, "name", "map");
        show_stat(os, indent, "lambda", lambda_);
        show_stat(os, indent, "size", size());
        show_stat(os, indent, "alloc_bytes", alloc_bytes());
#ifdef POPLAR_EXTRA_STATS
        show_stat(os, indent, "rate_steps", rate_steps());
#endif
        show_member(os, indent, "hash_trie_");
        hash_trie_.show_stats(os, n + 1);
        show_member(os, indent, "label_store_");
        label_store_.show_stats(os, n + 1);
    }